

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

EndsWith * __thiscall
Catch::Matchers::Impl::StdString::EndsWith::toString_abi_cxx11_(EndsWith *this)

{
  string local_38 [40];
  EndsWith *this_local;
  
  this_local = this;
  std::operator+((char *)local_38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "ends with: \"");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char *)local_38);
  std::__cxx11::string::~string(local_38);
  return this;
}

Assistant:

virtual std::string toString() const {
                return "ends with: \"" + m_substr + "\"";
            }